

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall CanSimulationDataGenerator::AddCrc(CanSimulationDataGenerator *this)

{
  vector<BitState,_std::allocator<BitState>_> *bits;
  U16 UVar1;
  BitState BVar2;
  BitState *__args;
  iterator iVar3;
  uint uVar4;
  int iVar5;
  BitState local_44;
  BitState local_40;
  BitState local_3c;
  vector<BitState,std::allocator<BitState>> *local_38;
  
  bits = &this->mFakeStuffedBits;
  std::vector<BitState,std::allocator<BitState>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>>
            ((vector<BitState,std::allocator<BitState>> *)bits,
             (this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (this->mFakeStartOfFrameField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->mFakeStartOfFrameField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<BitState,std::allocator<BitState>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>>
            ((vector<BitState,std::allocator<BitState>> *)bits,
             (this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (this->mFakeArbitrationField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->mFakeArbitrationField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<BitState,std::allocator<BitState>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>>
            ((vector<BitState,std::allocator<BitState>> *)bits,
             (this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (this->mFakeControlField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->mFakeControlField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<BitState,std::allocator<BitState>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>>
            ((vector<BitState,std::allocator<BitState>> *)bits,
             (this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (this->mFakeDataField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->mFakeDataField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_38 = (vector<BitState,std::allocator<BitState>> *)bits;
  UVar1 = ComputeCrc(this,bits,
                     (U32)((ulong)((long)(this->mFakeStuffedBits).
                                         super__Vector_base<BitState,_std::allocator<BitState>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->mFakeStuffedBits).
                                        super__Vector_base<BitState,_std::allocator<BitState>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2));
  uVar4 = 0x4000;
  iVar5 = 0xf;
  do {
    if ((uVar4 & UVar1) == 0) {
      BVar2 = CanAnalyzerSettings::Dominant(this->mSettings);
      iVar3._M_current =
           (this->mFakeCrcFieldWithoutDelimiter).
           super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      local_3c = BVar2;
      if (iVar3._M_current ==
          (this->mFakeCrcFieldWithoutDelimiter).
          super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        __args = &local_3c;
        goto LAB_0010aee7;
      }
LAB_0010aed0:
      *iVar3._M_current = BVar2;
      (this->mFakeCrcFieldWithoutDelimiter).super__Vector_base<BitState,_std::allocator<BitState>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    else {
      BVar2 = CanAnalyzerSettings::Recessive(this->mSettings);
      iVar3._M_current =
           (this->mFakeCrcFieldWithoutDelimiter).
           super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      __args = &local_40;
      local_40 = BVar2;
      if (iVar3._M_current !=
          (this->mFakeCrcFieldWithoutDelimiter).
          super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) goto LAB_0010aed0;
LAB_0010aee7:
      std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                (&this->mFakeCrcFieldWithoutDelimiter,iVar3,__args);
    }
    uVar4 = uVar4 >> 1;
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      std::vector<BitState,std::allocator<BitState>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>>
                (local_38,(this->mFakeStuffedBits).
                          super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                          super__Vector_impl_data._M_finish,
                 (this->mFakeCrcFieldWithoutDelimiter).
                 super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->mFakeCrcFieldWithoutDelimiter).
                 super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      local_44 = CanAnalyzerSettings::Recessive(this->mSettings);
      iVar3._M_current =
           (this->mFakeFixedFormBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->mFakeFixedFormBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                  (&this->mFakeFixedFormBits,iVar3,&local_44);
      }
      else {
        *iVar3._M_current = local_44;
        (this->mFakeFixedFormBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      return;
    }
  } while( true );
}

Assistant:

void CanSimulationDataGenerator::AddCrc()
{
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeStartOfFrameField.begin(), mFakeStartOfFrameField.end() );
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeArbitrationField.begin(), mFakeArbitrationField.end() );
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeControlField.begin(), mFakeControlField.end() );
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeDataField.begin(), mFakeDataField.end() );

    U32 bits_for_crc = mFakeStuffedBits.size();
    U16 crc = ComputeCrc( mFakeStuffedBits, bits_for_crc );
    U32 mask = 0x4000;
    for( U32 i = 0; i < 15; i++ )
    {
        if( ( mask & crc ) == 0 )
            mFakeCrcFieldWithoutDelimiter.push_back( mSettings->Dominant() );
        else
            mFakeCrcFieldWithoutDelimiter.push_back( mSettings->Recessive() );

        mask >>= 1;
    }

    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeCrcFieldWithoutDelimiter.begin(), mFakeCrcFieldWithoutDelimiter.end() );

    // CRC DELIMITER (Standard Format as well as Extended Format)
    // The CRC SEQUENCE is followed by the CRC DELIMITER which consists of a single
    // recessive bit.

    mFakeFixedFormBits.push_back( mSettings->Recessive() );
}